

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O2

FileType cmHexFileConverter::DetermineFileType(string *inFileName)

{
  FileType FVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  char buf [1024];
  
  __stream = (FILE *)cmsys::SystemTools::Fopen(inFileName,"rb");
  if (__stream != (FILE *)0x0) {
    pcVar4 = fgets(buf,0x400,__stream);
    if (pcVar4 == (char *)0x0) {
      buf[0] = '\0';
    }
    fclose(__stream);
    if (buf[0] == ':') {
      uVar5 = 0x20b;
      uVar6 = 0xb;
      FVar1 = IntelHex;
    }
    else {
      if (buf[0] != 'S') {
        return Binary;
      }
      uVar5 = 0x20e;
      uVar6 = 10;
      FVar1 = MotorolaSrec;
    }
    uVar2 = ChompStrlen(buf);
    if (uVar2 <= uVar5 && uVar6 <= uVar2) {
      uVar7 = 1;
      do {
        if (uVar2 == uVar7) {
          return FVar1;
        }
        iVar3 = isxdigit((int)buf[uVar7]);
        uVar7 = uVar7 + 1;
      } while (iVar3 != 0);
    }
  }
  return Binary;
}

Assistant:

cmHexFileConverter::FileType cmHexFileConverter::DetermineFileType(
  const std::string& inFileName)
{
  char buf[1024];
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  if (inFile == nullptr) {
    return Binary;
  }

  if (!fgets(buf, 1024, inFile)) {
    buf[0] = 0;
  }
  fclose(inFile);
  FileType type = Binary;
  unsigned int minLineLength = 0;
  unsigned int maxLineLength = 0;
  if (buf[0] == ':') // might be an intel hex file
  {
    type = IntelHex;
    minLineLength = INTEL_HEX_MIN_LINE_LENGTH;
    maxLineLength = INTEL_HEX_MAX_LINE_LENGTH;
  } else if (buf[0] == 'S') // might be a motorola srec file
  {
    type = MotorolaSrec;
    minLineLength = MOTOROLA_SREC_MIN_LINE_LENGTH;
    maxLineLength = MOTOROLA_SREC_MAX_LINE_LENGTH;
  } else {
    return Binary;
  }

  unsigned int slen = ChompStrlen(buf);
  if ((slen < minLineLength) || (slen > maxLineLength)) {
    return Binary;
  }

  for (unsigned int i = 1; i < slen; i++) {
    if (!isxdigit(buf[i])) {
      return Binary;
    }
  }
  return type;
}